

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

Instr * __thiscall
IRBuilder::BuildProfiledFieldLoad
          (IRBuilder *this,OpCode loadOp,RegOpnd *dstOpnd,SymOpnd *srcOpnd,CacheId inlineCacheIndex,
          bool *pUnprofiled)

{
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  JitProfilingInstr *pJVar4;
  JITTimeFunctionBody *pJVar5;
  ProfiledInstr *this_00;
  JITTimeProfileInfo *this_01;
  TSize *pTVar6;
  undefined4 *puVar7;
  char16 *pcVar8;
  FunctionJITTimeInfo *this_02;
  char16 *pcVar9;
  char local_1a8 [8];
  char valueTypeStr [256];
  char16 debugStringBuffer [42];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  bVar3 = Func::DoSimpleJitDynamicProfile(this->m_func);
  if (bVar3) {
    pJVar4 = IR::JitProfilingInstr::New
                       (loadOp,&dstOpnd->super_Opnd,&srcOpnd->super_Opnd,this->m_func);
    return &pJVar4->super_Instr;
  }
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar3 = JITTimeFunctionBody::HasProfileInfo(pJVar5);
  if (bVar3) {
    this_00 = IR::ProfiledInstr::New(loadOp,&dstOpnd->super_Opnd,&srcOpnd->super_Opnd,this->m_func);
    pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    this_01 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar5);
    pTVar6 = (TSize *)JITTimeProfileInfo::GetFldInfo(this_01,inlineCacheIndex);
    if ((this_00->super_Instr).m_kind == InstrKindProfiled) {
      (this_00->u).field_3.fldInfoData = *pTVar6;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar3) goto LAB_004d1048;
      *puVar7 = 0;
      IVar1 = (this_00->super_Instr).m_kind;
      (this_00->u).field_3.fldInfoData = *pTVar6;
      if (IVar1 != InstrKindProfiled) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
        if (!bVar3) goto LAB_004d1048;
        *puVar7 = 0;
      }
    }
    bVar3 = ValueType::IsUninitialized((ValueType *)&(this_00->u).field_3);
    *pUnprofiled = bVar3;
    if ((this_00->super_Instr).m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar3) goto LAB_004d1048;
      *puVar7 = 0;
    }
    IR::Opnd::SetValueType(&dstOpnd->super_Opnd,(ValueType)(this_00->u).field_3.fldInfoData.f1);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,DynamicProfilePhase);
    if (bVar3) {
      if ((this_00->super_Instr).m_kind != InstrKindProfiled) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
        if (!bVar3) {
LAB_004d1048:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      local_32[0] = (anon_union_2_4_ea848c7b_for_ValueType_13)(this_00->u).field_3.fldInfoData.f1;
      ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1a8);
      pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar5);
      this_02 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
      pcVar9 = FunctionJITTimeInfo::GetDebugNumberSet(this_02,(wchar (*) [42])(valueTypeStr + 0xf8))
      ;
      Output::Print(L"TestTrace function %s (%s) ValueType = %i ",pcVar8,pcVar9,
                    (char (*) [256])local_1a8);
      IR::Instr::DumpTestTrace(&this_00->super_Instr);
    }
  }
  else {
    this_00 = (ProfiledInstr *)0x0;
  }
  return &this_00->super_Instr;
}

Assistant:

IR::Instr *
IRBuilder::BuildProfiledFieldLoad(Js::OpCode loadOp, IR::RegOpnd *dstOpnd, IR::SymOpnd *srcOpnd, Js::CacheId inlineCacheIndex, bool *pUnprofiled)
{
    IR::Instr * instr = nullptr;

    // Prefer JitProfilingInstr if we're in simplejit
    if (m_func->DoSimpleJitDynamicProfile())
    {
        instr = IR::JitProfilingInstr::New(loadOp, dstOpnd, srcOpnd, m_func);
    }
    else if (this->m_func->HasProfileInfo())
    {
        instr = IR::ProfiledInstr::New(loadOp, dstOpnd, srcOpnd, m_func);
        instr->AsProfiledInstr()->u.FldInfo() = *(m_func->GetReadOnlyProfileInfo()->GetFldInfo(inlineCacheIndex));
        *pUnprofiled = !instr->AsProfiledInstr()->u.FldInfo().WasLdFldProfiled();
        dstOpnd->SetValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if(Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::DynamicProfilePhase))
        {
            const ValueType valueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            char valueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            valueType.ToString(valueTypeStr);
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Output::Print(_u("TestTrace function %s (%s) ValueType = %i "), m_func->GetJITFunctionBody()->GetDisplayName(), m_func->GetDebugNumberSet(debugStringBuffer), valueTypeStr);
            instr->DumpTestTrace();
        }
#endif
    }

    return instr;
}